

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

uint32 __thiscall
Js::TypedArrayBase::GetSourceLength
          (TypedArrayBase *this,RecyclableObject *arraySource,uint32 targetLength,uint32 offset)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  Var aValue;
  undefined4 *puVar4;
  uint uVar5;
  
  scriptContext =
       (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  aValue = JavascriptOperators::OP_GetProperty(arraySource,0xd1,scriptContext);
  if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00d684e5;
    *puVar4 = 0;
  }
  if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00d684e5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  else {
    uVar3 = JavascriptConversion::ToUInt32_Full(aValue,scriptContext);
    aValue = (Var)(ulong)uVar3;
  }
  uVar5 = (uint)aValue;
  if ((!CARRY4(offset,uVar5)) && (offset + uVar5 <= targetLength)) {
    return uVar5;
  }
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec24,(PCWSTR)0x0);
}

Assistant:

uint32 TypedArrayBase::GetSourceLength(RecyclableObject* arraySource, uint32 targetLength, uint32 offset)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 sourceLength = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetProperty(arraySource, PropertyIds::length, scriptContext), scriptContext);
        uint32 totalLength;
        if (UInt32Math::Add(offset, sourceLength, &totalLength) ||
            (totalLength > targetLength))
        {
            JavascriptError::ThrowRangeError(
                scriptContext, JSERR_InvalidTypedArrayLength);
        }
        return sourceLength;
    }